

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.c
# Opt level: O2

int blob_write_json(blob_t *blobs,int count,char *filename)

{
  blob_t *pbVar1;
  undefined8 uVar2;
  uint uVar3;
  FILE *__stream;
  FILE *__s;
  int *piVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  __s = fopen(filename,"wb");
  __stream = _stderr;
  if (__s == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    iVar6 = 0;
    fprintf(__stream,"failed to open %s : %s\n",filename,pcVar5);
  }
  else {
    fwrite("{\n  \"blobs\" : [\n",0x10,1,__s);
    uVar3 = count;
    if (count < 1) {
      uVar3 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      fwrite("    {\n",6,1,__s);
      pbVar1 = blobs + uVar7;
      fprintf(__s,"      \"label\" : %d,\n",(ulong)(uint)(int)pbVar1->label);
      contour_write_json(&pbVar1->external,"external",3,(FILE *)__s);
      fwrite(",\n",2,1,__s);
      if (pbVar1->internal != (contour_t *)0x0) {
        fwrite("      \"internals\" : [\n",0x16,1,__s);
        lVar9 = 0;
        for (lVar8 = 0; lVar8 < blobs[uVar7].internal_count; lVar8 = lVar8 + 1) {
          contour_write_json((contour_t *)((long)&(blobs[uVar7].internal)->count + lVar9),
                             (char *)0x0,4,(FILE *)__s);
          uVar2 = 0x20;
          if (lVar8 < (long)blobs[uVar7].internal_count + -1) {
            uVar2 = 0x2c;
          }
          fprintf(__s,"%c\n",uVar2);
          lVar9 = lVar9 + 0x10;
        }
        fwrite("      ],\n",9,1,__s);
      }
      fprintf(__s,"      \"euler_number\": %d\n",(ulong)(uint)blobs[uVar7].internal_count);
      uVar2 = 0x20;
      if ((long)uVar7 < (long)(count + -1)) {
        uVar2 = 0x2c;
      }
      fprintf(__s,"    }%c\n",uVar2);
    }
    fwrite("  ]\n}\n",6,1,__s);
    fclose(__s);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int blob_write_json(blob_t *blobs, int count, const char *filename)
{
    int i;
    FILE *out = fopen(filename, "wb");
    if(NULL == out)
    {
        fprintf(stderr, "failed to open %s : %s\n", filename, strerror(errno));
        return 0;
    }
    fprintf(out, "{\n  \"blobs\" : [\n");
    for(i=0; i<count; i++)
    {
        fprintf(out, "    {\n");
        fprintf(out, "      \"label\" : %d,\n", blobs[i].label);    
        contour_write_json(&blobs[i].external, "external", 3, out);
        fprintf(out, ",\n");
        if(NULL != blobs[i].internal)
        {
            int j;
            fprintf(out, "      \"internals\" : [\n");
            for(j=0; j<blobs[i].internal_count; j++)
            {
                contour_write_json(blobs[i].internal+j, NULL, 4, out);
                fprintf(out, "%c\n", (j < (blobs[i].internal_count-1)) ? ',' : ' ');
            }
            fprintf(out, "      ],\n");
        }
        fprintf(out, "      \"euler_number\": %d\n", blobs[i].internal_count);
        fprintf(out, "    }%c\n", (i < (count-1)) ? ',' : ' ');
    }
    fprintf(out, "  ]\n}\n");
    fclose(out);
    return 1;
}